

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  char *pcVar1;
  char cVar2;
  char *a_c_str;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ulong __n;
  
  pcVar5 = (this->pathname_).c_str_;
  if (pcVar5 != (char *)0x0) {
    __n = (this->pathname_).length_ + 1;
    a_c_str = (char *)operator_new__(__n);
    memset(a_c_str,0,__n);
    cVar2 = *pcVar5;
    pcVar3 = a_c_str;
    while (cVar2 != '\0') {
      *pcVar3 = cVar2;
      if (*pcVar5 == '/') {
        pcVar4 = pcVar5 + -1;
        do {
          pcVar5 = pcVar4 + 1;
          pcVar1 = pcVar4 + 1;
          pcVar4 = pcVar5;
        } while (*pcVar1 == '/');
      }
      else {
        pcVar5 = pcVar5 + 1;
      }
      pcVar3 = pcVar3 + 1;
      cVar2 = *pcVar5;
    }
    *pcVar3 = '\0';
    String::operator=(&this->pathname_,a_c_str);
    operator_delete__(a_c_str);
    return;
  }
  String::operator=(&this->pathname_,"");
  return;
}

Assistant:

void FilePath::Normalize() {
  if (pathname_.c_str() == NULL) {
    pathname_ = "";
    return;
  }
  const char* src = pathname_.c_str();
  char* const dest = new char[pathname_.length() + 1];
  char* dest_ptr = dest;
  memset(dest_ptr, 0, pathname_.length() + 1);

  while (*src != '\0') {
    *dest_ptr = *src;
    if (!IsPathSeparator(*src)) {
      src++;
    } else {
#if GTEST_HAS_ALT_PATH_SEP_
      if (*dest_ptr == kAlternatePathSeparator) {
        *dest_ptr = kPathSeparator;
      }
#endif
      while (IsPathSeparator(*src))
        src++;
    }
    dest_ptr++;
  }
  *dest_ptr = '\0';
  pathname_ = dest;
  delete[] dest;
}